

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O1

TestName * ApprovalTests::ApprovalTestNamer::getCurrentTest(void)

{
  TestName *pTVar1;
  string helpMessage;
  
  pTVar1 = currentTest((TestName *)0x0);
  return pTVar1;
}

Assistant:

TestName& ApprovalTestNamer::getCurrentTest()
    {
        try
        {
            return currentTest();
        }
        catch (const std::runtime_error&)
        {
            std::string helpMessage = getMisconfiguredMainHelp();
            throw std::runtime_error(helpMessage);
        }
    }